

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O0

Abc_Cex_t *
Bmc_CexCarePropagateBwd(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Int_t *vPriosIn,Vec_Int_t *vPriosFf)

{
  int iVar1;
  uint uVar2;
  Abc_Cex_t *pCexMin_00;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_48;
  int local_44;
  int i;
  int f;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObjRo;
  Abc_Cex_t *pCexMin;
  Vec_Int_t *vPriosFf_local;
  Vec_Int_t *vPriosIn_local;
  Abc_Cex_t *pCex_local;
  Gia_Man_t *p_local;
  
  pCexMin_00 = Abc_CexAlloc(pCex->nRegs,pCex->nPis,pCex->iFrame + 1);
  pCexMin_00->iPo = pCex->iPo;
  pCexMin_00->iFrame = pCex->iFrame;
  local_48 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar4 = false;
    if (local_48 < iVar1) {
      _i = Gia_ManCo(p,local_48);
      bVar4 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    *(ulong *)_i = *(ulong *)_i & 0x7fffffffffffffff;
    local_48 = local_48 + 1;
  }
  for (local_44 = pCex->iFrame; -1 < local_44; local_44 = local_44 + -1) {
    iVar1 = pCex->iFrame;
    pGVar3 = Gia_ManPo(p,pCex->iPo);
    *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0x7fffffffffffffff | (ulong)(local_44 == iVar1) << 0x3f;
    local_48 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar4 = false;
      if (local_48 < iVar1) {
        iVar1 = Gia_ManPiNum(p);
        pObjRi = Gia_ManCi(p,iVar1 + local_48);
        bVar4 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      uVar2 = Vec_IntEntry(vPriosFf,local_44 * pCex->nRegs + local_48);
      pObjRi->Value = uVar2;
      local_48 = local_48 + 1;
    }
    Bmc_CexCarePropagateFwdOne(p,pCex,local_44,vPriosIn);
    Bmc_CexCarePropagateBwdOne(p,pCex,local_44,pCexMin_00);
    local_48 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar4 = false;
      if (local_48 < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        _i = Gia_ManCo(p,iVar1 + local_48);
        bVar4 = false;
        if (_i != (Gia_Obj_t *)0x0) {
          iVar1 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar1 + local_48);
          bVar4 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar4) break;
      *(ulong *)_i = *(ulong *)_i & 0x7fffffffffffffff | *(ulong *)pObjRi & 0x8000000000000000;
      local_48 = local_48 + 1;
    }
  }
  return pCexMin_00;
}

Assistant:

Abc_Cex_t * Bmc_CexCarePropagateBwd( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Int_t * vPriosIn, Vec_Int_t * vPriosFf )
{
    Abc_Cex_t * pCexMin;
    Gia_Obj_t * pObjRo, * pObjRi;
    int f, i;
    pCexMin = Abc_CexAlloc( pCex->nRegs, pCex->nPis, pCex->iFrame + 1 );
    pCexMin->iPo    = pCex->iPo;
    pCexMin->iFrame = pCex->iFrame;
    Gia_ManForEachCo( p, pObjRi, i )
        pObjRi->fPhase = 0;
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        Gia_ManPo(p, pCex->iPo)->fPhase = (int)(f == pCex->iFrame);
        Gia_ManForEachRo( p, pObjRo, i )
            pObjRo->Value = Vec_IntEntry( vPriosFf, f * pCex->nRegs + i );
        Bmc_CexCarePropagateFwdOne( p, pCex, f, vPriosIn );
        Bmc_CexCarePropagateBwdOne( p, pCex, f, pCexMin );
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            pObjRi->fPhase = pObjRo->fPhase;
    }
    return pCexMin;
}